

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O3

void acutest_dump_(char *title,void *addr,size_t size)

{
  ulong uVar1;
  size_t sVar2;
  ushort **ppuVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint __c;
  char *__format;
  long lVar7;
  size_t sVar8;
  
  if (((1 < acutest_verbose_level_) && (acutest_current_test_ != (acutest_test_ *)0x0)) &&
     (acutest_cond_failed_ != 0)) {
    sVar8 = 0x400;
    uVar1 = size - 0x400;
    if (size < 0x400) {
      sVar8 = size;
      uVar1 = 0;
    }
    acutest_line_indent_(3 - (uint)(acutest_case_name_[0] == '\0'));
    sVar2 = strlen(title);
    __format = "%s:\n";
    if (title[sVar2 - 1] == ':') {
      __format = "%s\n";
    }
    printf(__format,title);
    if (size != 0) {
      uVar4 = 0;
      do {
        acutest_line_indent_(4 - (uint)(acutest_case_name_[0] == '\0'));
        printf("%08lx: ",uVar4);
        lVar7 = 0x10;
        uVar5 = uVar4;
        do {
          if (uVar5 < sVar8) {
            printf(" %02x",(ulong)*(byte *)((long)addr + uVar5));
          }
          else {
            printf("   ");
          }
          uVar5 = uVar5 + 1;
          lVar7 = lVar7 + -1;
        } while (lVar7 != 0);
        uVar5 = uVar4 + 0x10;
        printf("  ");
        uVar6 = sVar8;
        if (uVar5 < sVar8) {
          uVar6 = uVar5;
        }
        if (uVar4 < sVar8) {
          ppuVar3 = __ctype_b_loc();
          do {
            __c = (uint)*(byte *)((long)addr + uVar4);
            if (((*ppuVar3)[*(byte *)((long)addr + uVar4)] & 2) != 0) {
              __c = 0x2e;
            }
            putchar(__c);
            uVar4 = uVar4 + 1;
          } while (uVar4 < uVar6);
        }
        putchar(10);
        uVar4 = uVar5;
      } while (uVar5 < sVar8);
      if (0x400 < size) {
        acutest_line_indent_(4 - (uint)(acutest_case_name_[0] == '\0'));
        printf("           ... (and more %u bytes)\n",uVar1 & 0xffffffff);
        return;
      }
    }
  }
  return;
}

Assistant:

void
acutest_dump_(const char* title, const void* addr, size_t size)
{
    static const size_t BYTES_PER_LINE = 16;
    size_t line_beg;
    size_t truncate = 0;

    if(acutest_verbose_level_ < 2)
        return;

    /* We allow extra message only when something is already wrong in the
     * current test. */
    if(acutest_current_test_ == NULL  ||  !acutest_cond_failed_)
        return;

    if(size > TEST_DUMP_MAXSIZE) {
        truncate = size - TEST_DUMP_MAXSIZE;
        size = TEST_DUMP_MAXSIZE;
    }

    acutest_line_indent_(acutest_case_name_[0] ? 3 : 2);
    printf((title[strlen(title)-1] == ':') ? "%s\n" : "%s:\n", title);

    for(line_beg = 0; line_beg < size; line_beg += BYTES_PER_LINE) {
        size_t line_end = line_beg + BYTES_PER_LINE;
        size_t off;

        acutest_line_indent_(acutest_case_name_[0] ? 4 : 3);
        printf("%08lx: ", (unsigned long)line_beg);
        for(off = line_beg; off < line_end; off++) {
            if(off < size)
                printf(" %02x", ((const unsigned char*)addr)[off]);
            else
                printf("   ");
        }

        printf("  ");
        for(off = line_beg; off < line_end; off++) {
            unsigned char byte = ((const unsigned char*)addr)[off];
            if(off < size)
                printf("%c", (iscntrl(byte) ? '.' : byte));
            else
                break;
        }

        printf("\n");
    }

    if(truncate > 0) {
        acutest_line_indent_(acutest_case_name_[0] ? 4 : 3);
        printf("           ... (and more %u bytes)\n", (unsigned) truncate);
    }
}